

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O2

void __thiscall ON_Quaternion::SetRotation(ON_Quaternion *this,double angle,ON_3dVector *axis)

{
  double dVar1;
  double dVar2;
  
  dVar1 = ON_3dVector::Length(axis);
  dVar2 = 0.0;
  if (0.0 < dVar1) {
    dVar2 = sin(angle * 0.5);
    dVar2 = dVar2 / dVar1;
  }
  dVar1 = cos(angle * 0.5);
  this->a = dVar1;
  dVar1 = axis->y;
  this->b = dVar2 * axis->x;
  this->c = dVar2 * dVar1;
  this->d = dVar2 * axis->z;
  return;
}

Assistant:

void ON_Quaternion::SetRotation(double angle, const ON_3dVector& axis)
{
  double s = axis.Length();
  s = (s > 0.0) ? sin(0.5*angle)/s : 0.0;
  a = cos(0.5*angle);
  b = s*axis.x;
  c = s*axis.y;
  d = s*axis.z;
}